

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O2

void wasm::ControlFlowWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>::scan
               (SpillPointers *self,Expression **currp)

{
  Expression *pEVar1;
  ulong uVar2;
  
  pEVar1 = *currp;
  uVar2 = (ulong)pEVar1->_id;
  if ((uVar2 < 0x32) && ((0x200000000000eU >> (uVar2 & 0x3f) & 1) != 0)) {
    Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>::pushTask
              ((Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_> *)
               &(self->
                super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
                ).
                super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
               ,doPostVisitControlFlow,currp);
  }
  PostWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>::scan(self,currp);
  uVar2 = (ulong)pEVar1->_id;
  if ((uVar2 < 0x32) && ((0x200000000000eU >> (uVar2 & 0x3f) & 1) != 0)) {
    Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>::pushTask
              ((Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_> *)
               &(self->
                super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
                ).
                super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
               ,doPreVisitControlFlow,currp);
    return;
  }
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    auto* curr = *currp;

    switch (curr->_id) {
      case Expression::Id::BlockId:
      case Expression::Id::IfId:
      case Expression::Id::LoopId:
      case Expression::Id::TryId: {
        self->pushTask(SubType::doPostVisitControlFlow, currp);
        break;
      }
      default: {
      }
    }

    PostWalker<SubType, VisitorType>::scan(self, currp);

    switch (curr->_id) {
      case Expression::Id::BlockId:
      case Expression::Id::IfId:
      case Expression::Id::LoopId:
      case Expression::Id::TryId: {
        self->pushTask(SubType::doPreVisitControlFlow, currp);
        break;
      }
      default: {
      }
    }
  }